

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  pointer pMVar2;
  size_t _elemsize;
  Mat *pMVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  size_t b_2;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  size_t b_4;
  size_t sVar13;
  size_t b;
  ulong uVar14;
  void *pvVar15;
  bool bVar16;
  int local_a8;
  Mat local_70;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = pMVar2->dims;
  _elemsize = pMVar2->elemsize;
  if (uVar5 == 1) {
    lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
    piVar12 = &pMVar2->w;
    iVar10 = 0;
    while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
      iVar10 = iVar10 + *piVar12;
      piVar12 = piVar12 + 0x10;
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar10,_elemsize,opt->blob_allocator);
    pvVar15 = pMVar3->data;
    local_a8 = -100;
    if ((pvVar15 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
      local_a8 = 0;
      lVar7 = 0;
      for (uVar14 = 0;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar14 < (ulong)((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
          uVar14 = uVar14 + 1) {
        sVar13 = (long)*(int *)((long)&pMVar2->w + lVar7) * _elemsize;
        memcpy(pvVar15,*(void **)((long)&pMVar2->data + lVar7),sVar13);
        pvVar15 = (void *)((long)pvVar15 + sVar13);
        lVar7 = lVar7 + 0x40;
      }
    }
  }
  else {
    uVar1 = this->axis;
    if ((uVar5 ^ 2) == 0 && uVar1 == 0) {
      iVar10 = pMVar2->w;
      lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
      piVar12 = &pMVar2->h;
      iVar4 = 0;
      while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
        iVar4 = iVar4 + *piVar12;
        piVar12 = piVar12 + 0x10;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar10,iVar4,_elemsize,opt->blob_allocator);
      pvVar15 = pMVar3->data;
      local_a8 = -100;
      if ((pvVar15 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_a8 = 0;
        lVar7 = 0;
        for (uVar14 = 0;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar14 < (ulong)((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
            uVar14 = uVar14 + 1) {
          sVar13 = (long)*(int *)((long)&pMVar2->h + lVar7) * _elemsize * (long)iVar10;
          memcpy(pvVar15,*(void **)((long)&pMVar2->data + lVar7),sVar13);
          pvVar15 = (void *)((long)pvVar15 + sVar13);
          lVar7 = lVar7 + 0x40;
        }
      }
    }
    else if ((uVar5 ^ 2) == 0 && (uVar1 ^ 1) == 0) {
      iVar10 = pMVar2->h;
      lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
      piVar12 = &pMVar2->w;
      iVar4 = 0;
      while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
        iVar4 = iVar4 + *piVar12;
        piVar12 = piVar12 + 0x10;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar4,iVar10,_elemsize,opt->blob_allocator);
      local_a8 = -100;
      if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_a8 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        for (iVar4 = 0; iVar4 != iVar10; iVar4 = iVar4 + 1) {
          pvVar15 = (void *)((long)pMVar3->w * (long)iVar4 * pMVar3->elemsize + (long)pMVar3->data);
          lVar7 = 0x2c;
          for (uVar14 = 0;
              pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
              uVar14 < (ulong)((long)(bottom_blobs->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
              uVar14 = uVar14 + 1) {
            lVar8 = (long)*(int *)((long)&pMVar2->data + lVar7);
            memcpy(pvVar15,(void *)(lVar8 * iVar4 * *(long *)((long)pMVar2 + lVar7 + -0x1c) +
                                   *(long *)((long)pMVar2 + lVar7 + -0x2c)),lVar8 * _elemsize);
            pvVar15 = (void *)((long)pvVar15 +
                              (long)*(int *)((long)&pMVar2->data + lVar7) * _elemsize);
            lVar7 = lVar7 + 0x40;
          }
        }
      }
    }
    else {
      uVar5 = uVar5 ^ 3;
      if (uVar5 == 0 && uVar1 == 0) {
        lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
        piVar12 = &pMVar2->c;
        iVar10 = 0;
        while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
          iVar10 = iVar10 + *piVar12;
          piVar12 = piVar12 + 0x10;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar2->w,pMVar2->h,iVar10,_elemsize,opt->blob_allocator);
        local_a8 = -100;
        if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
          local_a8 = 0;
          lVar7 = 0x38;
          iVar10 = 0;
          for (uVar14 = 0;
              pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
              uVar14 < (ulong)((long)(bottom_blobs->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6);
              uVar14 = uVar14 + 1) {
            iVar4 = *(int *)((long)pMVar2 + lVar7 + -4);
            pvVar15 = *(void **)((long)pMVar2 + lVar7 + -0x38);
            lVar8 = *(long *)((long)&pMVar2->data + lVar7);
            Mat::channel(&local_70,pMVar3,iVar10);
            pvVar9 = local_70.data;
            Mat::~Mat(&local_70);
            memcpy(pvVar9,pvVar15,(long)iVar4 * _elemsize * lVar8);
            iVar10 = iVar10 + iVar4;
            lVar7 = lVar7 + 0x40;
          }
        }
      }
      else if ((uVar1 ^ 1) == 0 && uVar5 == 0) {
        iVar10 = pMVar2->c;
        lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
        piVar12 = &pMVar2->h;
        iVar4 = 0;
        while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
          iVar4 = iVar4 + *piVar12;
          piVar12 = piVar12 + 0x10;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,pMVar2->w,iVar4,iVar10,_elemsize,opt->blob_allocator);
        local_a8 = -100;
        if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
          local_a8 = 0;
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          for (iVar4 = 0; iVar4 != iVar10; iVar4 = iVar4 + 1) {
            Mat::channel(&local_70,pMVar3,iVar4);
            pvVar15 = local_70.data;
            Mat::~Mat(&local_70);
            lVar7 = 0;
            for (uVar14 = 0;
                pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                uVar14 < (ulong)((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6
                                ); uVar14 = uVar14 + 1) {
              iVar11 = *(int *)((long)&pMVar2->w + lVar7);
              iVar6 = *(int *)((long)&pMVar2->h + lVar7);
              Mat::channel(&local_70,(Mat *)((long)&pMVar2->data + lVar7),iVar4);
              pvVar9 = local_70.data;
              Mat::~Mat(&local_70);
              sVar13 = (long)iVar6 * (long)iVar11 * _elemsize;
              memcpy(pvVar15,pvVar9,sVar13);
              pvVar15 = (void *)((long)pvVar15 + sVar13);
              lVar7 = lVar7 + 0x40;
            }
          }
        }
      }
      else {
        local_a8 = 0;
        if (uVar5 == 0 && uVar1 == 2) {
          iVar10 = pMVar2->h;
          iVar4 = pMVar2->c;
          lVar7 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 6;
          piVar12 = &pMVar2->w;
          iVar11 = 0;
          while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
            iVar11 = iVar11 + *piVar12;
            piVar12 = piVar12 + 0x10;
          }
          pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          Mat::create(pMVar3,iVar11,iVar10,iVar4,_elemsize,opt->blob_allocator);
          local_a8 = -100;
          if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            local_a8 = 0;
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            for (iVar11 = 0; iVar11 != iVar4; iVar11 = iVar11 + 1) {
              Mat::channel(&local_70,pMVar3,iVar11);
              pvVar15 = local_70.data;
              Mat::~Mat(&local_70);
              for (iVar6 = 0; iVar6 != iVar10; iVar6 = iVar6 + 1) {
                lVar7 = 0;
                for (uVar14 = 0;
                    pMVar2 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_start,
                    uVar14 < (ulong)((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar2 >> 6); uVar14 = uVar14 + 1) {
                  Mat::channel(&local_70,(Mat *)((long)&pMVar2->data + lVar7),iVar11);
                  pvVar9 = (void *)((long)local_70.w * (long)iVar6 * local_70.elemsize +
                                   (long)local_70.data);
                  Mat::~Mat(&local_70);
                  memcpy(pvVar15,pvVar9,(long)*(int *)((long)&pMVar2->w + lVar7) * _elemsize);
                  pvVar15 = (void *)((long)pvVar15 +
                                    (long)*(int *)((long)&pMVar2->w + lVar7) * _elemsize);
                  lVar7 = lVar7 + 0x40;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_a8;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const unsigned char* ptr = bottom_blob.channel(q).row<const unsigned char>(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elemsize;
                }
            }
        }

        return 0;
    }

    return 0;
}